

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O1

PrimInfoMB * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
          *this,mvector<PrimRefMB> *prims,BBox1f *t0t1,range<unsigned_long> *r,size_t k,uint geomID)

{
  float fVar1;
  undefined8 uVar2;
  BBox1f BVar3;
  BufferView<embree::Vec3fx> *pBVar4;
  PrimRefMB *pPVar5;
  BufferView<embree::Vec3fx> *pBVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar11;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar12;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  uint uVar21;
  char *pcVar22;
  ulong uVar23;
  int iVar24;
  ulong uVar25;
  size_t sVar26;
  int iVar27;
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar32;
  float fVar33;
  undefined1 auVar34 [16];
  float fVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar41;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [64];
  float fVar45;
  float fVar46;
  undefined1 auVar44 [16];
  float fVar47;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar48;
  float fVar53;
  float fVar54;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar50;
  undefined1 auVar51 [16];
  float fVar55;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar56;
  undefined1 auVar57 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar58;
  undefined1 auVar59 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar60;
  undefined1 auVar61 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar62;
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  size_t local_218;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  unsigned_long local_1d8;
  size_t local_1c0;
  ulong local_170;
  anon_class_16_2_07cfa4d6 local_168;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_158;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_138;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  undefined1 local_88 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined1 auVar49 [64];
  undefined1 auVar52 [64];
  
  aVar48.m128[2] = INFINITY;
  aVar48._0_8_ = 0x7f8000007f800000;
  aVar48.m128[3] = INFINITY;
  auVar49 = ZEXT1664((undefined1  [16])aVar48);
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = aVar48;
  aVar50.m128[2] = -INFINITY;
  aVar50._0_8_ = 0xff800000ff800000;
  aVar50.m128[3] = -INFINITY;
  auVar52 = ZEXT1664((undefined1  [16])aVar50);
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = aVar50;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = aVar48;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = aVar50;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = aVar48;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = aVar50;
  (__return_storage_ptr__->object_range)._begin = 0;
  (__return_storage_ptr__->object_range)._end = 0;
  __return_storage_ptr__->num_time_segments = 0;
  __return_storage_ptr__->max_num_time_segments = 0;
  (__return_storage_ptr__->max_time_range).lower = 0.0;
  auVar29._8_4_ = 0x3f800000;
  auVar29._0_8_ = &DAT_3f8000003f800000;
  auVar29._12_4_ = 0x3f800000;
  uVar2 = vmovlps_avx(auVar29);
  *(undefined8 *)&(__return_storage_ptr__->max_time_range).upper = uVar2;
  (__return_storage_ptr__->time_range).upper = 0.0;
  uVar17 = r->_begin;
  local_218 = __return_storage_ptr__->num_time_segments;
  uVar23 = __return_storage_ptr__->max_num_time_segments;
  auVar30._0_4_ = (__return_storage_ptr__->max_time_range).lower;
  auVar30._4_4_ = (__return_storage_ptr__->max_time_range).upper;
  auVar30._8_4_ = (__return_storage_ptr__->time_range).lower;
  auVar30._12_4_ = (__return_storage_ptr__->time_range).upper;
  auVar43 = ZEXT1664(auVar30);
  aVar62 = aVar48;
  aVar60 = aVar50;
  aVar58 = aVar48;
  aVar56 = aVar50;
  if (uVar17 < r->_end) {
    local_1d8 = (__return_storage_ptr__->object_range)._end;
    auVar64 = ZEXT1664(ZEXT816(0) << 0x40);
    auVar65 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
    auVar63 = ZEXT1664((undefined1  [16])aVar48);
    auVar61 = ZEXT1664((undefined1  [16])aVar50);
    auVar59 = ZEXT1664((undefined1  [16])aVar48);
    auVar57 = ZEXT1664((undefined1  [16])aVar50);
    local_1c0 = k;
    do {
      BVar3 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry
              .super_Geometry.time_range;
      auVar38._8_8_ = 0;
      auVar38._0_4_ = BVar3.lower;
      auVar38._4_4_ = BVar3.upper;
      fVar33 = BVar3.lower;
      auVar30 = vmovshdup_avx(auVar38);
      fVar41 = auVar30._0_4_ - fVar33;
      uVar18 = *(uint *)(*(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>
                                   ).super_CurveGeometry.super_Geometry.field_0x58 +
                        *(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>)
                                  .super_CurveGeometry.field_0x68 * uVar17);
      uVar16 = (ulong)uVar18;
      uVar25 = (ulong)(uVar18 + 1);
      pBVar4 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
               super_CurveGeometry.vertices.items;
      if (uVar25 < (pBVar4->super_RawBufferView).num) {
        fVar1 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                super_CurveGeometry.super_Geometry.fnumTimeSegments;
        auVar30 = ZEXT416((uint)(fVar1 * ((t0t1->lower - fVar33) / fVar41) * 1.0000002));
        auVar30 = vroundss_avx(auVar30,auVar30,9);
        auVar30 = vmaxss_avx(auVar64._0_16_,auVar30);
        uVar18 = (uint)auVar30._0_4_;
        auVar30 = ZEXT416((uint)(fVar1 * ((t0t1->upper - fVar33) / fVar41) * 0.99999976));
        auVar30 = vroundss_avx(auVar30,auVar30,10);
        auVar30 = vminss_avx(auVar30,ZEXT416((uint)fVar1));
        uVar21 = (uint)auVar30._0_4_;
        bVar9 = uVar21 < uVar18;
        auVar36._8_4_ = 0x5dccb9a2;
        auVar36._0_8_ = 0x5dccb9a25dccb9a2;
        auVar36._12_4_ = 0x5dccb9a2;
        auVar30 = auVar65._0_16_;
        if (uVar18 <= uVar21) {
          uVar19 = (ulong)(int)uVar18;
          lVar20 = uVar19 * 0x38;
          pcVar22 = pBVar4[uVar19].super_RawBufferView.ptr_ofs;
          sVar26 = pBVar4[uVar19].super_RawBufferView.stride;
          auVar29 = vcmpps_avx(*(undefined1 (*) [16])(pcVar22 + sVar26 * uVar16),auVar30,2);
          auVar38 = vcmpps_avx(*(undefined1 (*) [16])(pcVar22 + sVar26 * uVar16),auVar36,5);
          auVar29 = vorps_avx(auVar29,auVar38);
          if ((((auVar29 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar29 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar29 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar29[0xf]) {
            pBVar6 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                     super_CurveGeometry.tangents.items;
            do {
              auVar29 = vcmpps_avx(*(undefined1 (*) [16])(pcVar22 + sVar26 * uVar25),auVar30,2);
              auVar38 = vcmpps_avx(*(undefined1 (*) [16])(pcVar22 + sVar26 * uVar25),auVar36,5);
              auVar29 = vorps_avx(auVar29,auVar38);
              if ((((auVar29 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar29 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar29 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar29[0xf] < '\0') break;
              lVar7 = *(long *)((long)&(pBVar6->super_RawBufferView).ptr_ofs + lVar20);
              lVar8 = *(long *)((long)&(pBVar6->super_RawBufferView).stride + lVar20);
              auVar29 = *(undefined1 (*) [16])(lVar7 + lVar8 * uVar16);
              auVar38 = vcmpps_avx(auVar29,auVar30,2);
              auVar29 = vcmpps_avx(auVar29,auVar36,5);
              auVar29 = vorps_avx(auVar38,auVar29);
              if ((((auVar29 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar29 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar29 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar29[0xf] < '\0') break;
              auVar29 = *(undefined1 (*) [16])(lVar7 + lVar8 * uVar25);
              auVar38 = vcmpps_avx(auVar29,auVar30,2);
              auVar29 = vcmpps_avx(auVar29,auVar36,5);
              auVar29 = vorps_avx(auVar38,auVar29);
              if ((((auVar29 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar29 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar29 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar29[0xf] < '\0') break;
              uVar19 = uVar19 + 1;
              bVar9 = (ulong)(long)(int)uVar21 < uVar19;
              if ((ulong)(long)(int)uVar21 < uVar19) goto LAB_012fd894;
              pcVar22 = *(char **)((long)&pBVar4[1].super_RawBufferView.ptr_ofs + lVar20);
              sVar26 = *(size_t *)((long)&pBVar4[1].super_RawBufferView.stride + lVar20);
              lVar20 = lVar20 + 0x38;
              auVar29 = vcmpps_avx(*(undefined1 (*) [16])(pcVar22 + sVar26 * uVar16),auVar30,2);
              auVar38 = vcmpps_avx(*(undefined1 (*) [16])(pcVar22 + sVar26 * uVar16),auVar36,5);
              auVar29 = vorps_avx(auVar29,auVar38);
            } while ((((auVar29 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                      (auVar29 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar29 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     -1 < auVar29[0xf]);
          }
          if (!bVar9) goto LAB_012fde04;
        }
LAB_012fd894:
        local_118 = auVar63._0_16_;
        local_108 = auVar61._0_16_;
        local_f8 = auVar59._0_16_;
        local_e8 = auVar57._0_16_;
        local_d8 = auVar43._0_16_;
        local_c8 = auVar52._0_16_;
        local_b8 = auVar49._0_16_;
        local_168.primID = &local_170;
        fVar41 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                 super_CurveGeometry.super_Geometry.time_range.lower;
        fVar28 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                 super_CurveGeometry.super_Geometry.time_range.upper - fVar41;
        fVar32 = (t0t1->lower - fVar41) / fVar28;
        fVar28 = (t0t1->upper - fVar41) / fVar28;
        fVar41 = fVar1 * fVar32;
        fVar33 = fVar1 * fVar28;
        auVar38 = vroundss_avx(ZEXT416((uint)fVar41),ZEXT416((uint)fVar41),9);
        auVar36 = vroundss_avx(ZEXT416((uint)fVar33),ZEXT416((uint)fVar33),10);
        auVar30 = vmaxss_avx(auVar38,auVar64._0_16_);
        auVar29 = vminss_avx(auVar36,ZEXT416((uint)fVar1));
        iVar24 = (int)auVar30._0_4_;
        fVar35 = auVar29._0_4_;
        uVar18 = (int)auVar38._0_4_;
        if ((int)auVar38._0_4_ < 0) {
          uVar18 = 0xffffffff;
        }
        iVar27 = (int)fVar1 + 1;
        if ((int)auVar36._0_4_ < (int)fVar1 + 1) {
          iVar27 = (int)auVar36._0_4_;
        }
        local_170 = uVar17;
        local_168.this = this;
        linearBounds::anon_class_16_2_07cfa4d6::operator()
                  ((BBox3fa *)&local_138.field_1,&local_168,(long)iVar24);
        linearBounds::anon_class_16_2_07cfa4d6::operator()
                  ((BBox3fa *)&local_158.field_1,&local_168,(long)(int)fVar35);
        fVar41 = fVar41 - auVar30._0_4_;
        if (iVar27 - uVar18 == 1) {
          auVar30 = vmaxss_avx(ZEXT416((uint)fVar41),ZEXT816(0) << 0x40);
          auVar29 = vshufps_avx(auVar30,auVar30,0);
          auVar30 = ZEXT416((uint)(1.0 - auVar30._0_4_));
          auVar30 = vshufps_avx(auVar30,auVar30,0);
          auVar51._0_4_ = auVar29._0_4_ * local_158.m128[0] + auVar30._0_4_ * local_138.m128[0];
          auVar51._4_4_ = auVar29._4_4_ * local_158.m128[1] + auVar30._4_4_ * local_138.m128[1];
          auVar51._8_4_ = auVar29._8_4_ * local_158.m128[2] + auVar30._8_4_ * local_138.m128[2];
          auVar51._12_4_ = auVar29._12_4_ * local_158.m128[3] + auVar30._12_4_ * local_138.m128[3];
          auVar44._0_4_ = auVar29._0_4_ * local_148 + auVar30._0_4_ * local_128;
          auVar44._4_4_ = auVar29._4_4_ * fStack_144 + auVar30._4_4_ * fStack_124;
          auVar44._8_4_ = auVar29._8_4_ * fStack_140 + auVar30._8_4_ * fStack_120;
          auVar44._12_4_ = auVar29._12_4_ * fStack_13c + auVar30._12_4_ * fStack_11c;
          auVar30 = vmaxss_avx(ZEXT416((uint)(fVar35 - fVar33)),ZEXT816(0) << 0x40);
          auVar29 = vshufps_avx(auVar30,auVar30,0);
          auVar30 = ZEXT416((uint)(1.0 - auVar30._0_4_));
          auVar30 = vshufps_avx(auVar30,auVar30,0);
          auVar34._0_4_ = auVar30._0_4_ * local_158.m128[0] + auVar29._0_4_ * local_138.m128[0];
          auVar34._4_4_ = auVar30._4_4_ * local_158.m128[1] + auVar29._4_4_ * local_138.m128[1];
          auVar34._8_4_ = auVar30._8_4_ * local_158.m128[2] + auVar29._8_4_ * local_138.m128[2];
          auVar34._12_4_ = auVar30._12_4_ * local_158.m128[3] + auVar29._12_4_ * local_138.m128[3];
          auVar39._0_4_ = auVar30._0_4_ * local_148 + auVar29._0_4_ * local_128;
          auVar39._4_4_ = auVar30._4_4_ * fStack_144 + auVar29._4_4_ * fStack_124;
          auVar39._8_4_ = auVar30._8_4_ * fStack_140 + auVar29._8_4_ * fStack_120;
          auVar39._12_4_ = auVar30._12_4_ * fStack_13c + auVar29._12_4_ * fStack_11c;
        }
        else {
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_58.field_1,&local_168,(long)(iVar24 + 1));
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_78.field_1,&local_168,(long)((int)fVar35 + -1));
          auVar30 = vmaxss_avx(ZEXT416((uint)fVar41),ZEXT816(0) << 0x40);
          auVar29 = vshufps_avx(auVar30,auVar30,0);
          auVar30 = ZEXT416((uint)(1.0 - auVar30._0_4_));
          auVar30 = vshufps_avx(auVar30,auVar30,0);
          auVar51._0_4_ = auVar29._0_4_ * local_58.m128[0] + auVar30._0_4_ * local_138.m128[0];
          auVar51._4_4_ = auVar29._4_4_ * local_58.m128[1] + auVar30._4_4_ * local_138.m128[1];
          auVar51._8_4_ = auVar29._8_4_ * local_58.m128[2] + auVar30._8_4_ * local_138.m128[2];
          auVar51._12_4_ = auVar29._12_4_ * local_58.m128[3] + auVar30._12_4_ * local_138.m128[3];
          auVar44._0_4_ = auVar29._0_4_ * local_48 + auVar30._0_4_ * local_128;
          auVar44._4_4_ = auVar29._4_4_ * fStack_44 + auVar30._4_4_ * fStack_124;
          auVar44._8_4_ = auVar29._8_4_ * fStack_40 + auVar30._8_4_ * fStack_120;
          auVar44._12_4_ = auVar29._12_4_ * fStack_3c + auVar30._12_4_ * fStack_11c;
          auVar30 = vmaxss_avx(ZEXT416((uint)(fVar35 - fVar33)),ZEXT816(0) << 0x40);
          auVar29 = vshufps_avx(auVar30,auVar30,0);
          auVar30 = ZEXT416((uint)(1.0 - auVar30._0_4_));
          auVar30 = vshufps_avx(auVar30,auVar30,0);
          auVar34._0_4_ = auVar29._0_4_ * local_78.m128[0] + auVar30._0_4_ * local_158.m128[0];
          auVar34._4_4_ = auVar29._4_4_ * local_78.m128[1] + auVar30._4_4_ * local_158.m128[1];
          auVar34._8_4_ = auVar29._8_4_ * local_78.m128[2] + auVar30._8_4_ * local_158.m128[2];
          auVar34._12_4_ = auVar29._12_4_ * local_78.m128[3] + auVar30._12_4_ * local_158.m128[3];
          auVar39._0_4_ = auVar29._0_4_ * local_68 + auVar30._0_4_ * local_148;
          auVar39._4_4_ = auVar29._4_4_ * fStack_64 + auVar30._4_4_ * fStack_144;
          auVar39._8_4_ = auVar29._8_4_ * fStack_60 + auVar30._8_4_ * fStack_140;
          auVar39._12_4_ = auVar29._12_4_ * fStack_5c + auVar30._12_4_ * fStack_13c;
          if ((int)(uVar18 + 1) < iVar27) {
            sVar26 = (size_t)(uVar18 + 1);
            iVar27 = ~uVar18 + iVar27;
            do {
              auVar31._0_4_ = ((float)(int)sVar26 / fVar1 - fVar32) / (fVar28 - fVar32);
              auVar31._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar30 = vshufps_avx(auVar31,auVar31,0);
              local_1e8 = auVar34._0_4_;
              fStack_1e4 = auVar34._4_4_;
              fStack_1e0 = auVar34._8_4_;
              fStack_1dc = auVar34._12_4_;
              auVar29 = vshufps_avx(ZEXT416((uint)(1.0 - auVar31._0_4_)),
                                    ZEXT416((uint)(1.0 - auVar31._0_4_)),0);
              fVar53 = auVar51._4_4_;
              fVar54 = auVar51._8_4_;
              fVar55 = auVar51._12_4_;
              fVar41 = auVar39._4_4_;
              fVar33 = auVar39._8_4_;
              fVar35 = auVar39._12_4_;
              fVar45 = auVar44._4_4_;
              fVar46 = auVar44._8_4_;
              fVar47 = auVar44._12_4_;
              local_a8 = auVar39._0_4_ * auVar30._0_4_ + auVar44._0_4_ * auVar29._0_4_;
              fStack_a4 = fVar41 * auVar30._4_4_ + fVar45 * auVar29._4_4_;
              fStack_a0 = fVar33 * auVar30._8_4_ + fVar46 * auVar29._8_4_;
              fStack_9c = fVar35 * auVar30._12_4_ + fVar47 * auVar29._12_4_;
              linearBounds::anon_class_16_2_07cfa4d6::operator()
                        ((BBox3fa *)&local_98.field_1,&local_168,sVar26);
              auVar14._4_4_ = auVar30._4_4_ * fStack_1e4 + fVar53 * auVar29._4_4_;
              auVar14._0_4_ = auVar30._0_4_ * local_1e8 + auVar51._0_4_ * auVar29._0_4_;
              auVar14._8_4_ = auVar30._8_4_ * fStack_1e0 + fVar54 * auVar29._8_4_;
              auVar14._12_4_ = auVar30._12_4_ * fStack_1dc + fVar55 * auVar29._12_4_;
              auVar30 = vsubps_avx((undefined1  [16])local_98,auVar14);
              auVar15._4_4_ = fStack_a4;
              auVar15._0_4_ = local_a8;
              auVar15._8_4_ = fStack_a0;
              auVar15._12_4_ = fStack_9c;
              auVar38 = vsubps_avx(local_88,auVar15);
              auVar29 = vminps_avx(auVar30,ZEXT816(0) << 0x40);
              auVar30 = vmaxps_avx(auVar38,ZEXT816(0) << 0x40);
              auVar51._0_4_ = auVar51._0_4_ + auVar29._0_4_;
              auVar51._4_4_ = fVar53 + auVar29._4_4_;
              auVar51._8_4_ = fVar54 + auVar29._8_4_;
              auVar51._12_4_ = fVar55 + auVar29._12_4_;
              auVar34._0_4_ = local_1e8 + auVar29._0_4_;
              auVar34._4_4_ = fStack_1e4 + auVar29._4_4_;
              auVar34._8_4_ = fStack_1e0 + auVar29._8_4_;
              auVar34._12_4_ = fStack_1dc + auVar29._12_4_;
              auVar44._0_4_ = auVar44._0_4_ + auVar30._0_4_;
              auVar44._4_4_ = fVar45 + auVar30._4_4_;
              auVar44._8_4_ = fVar46 + auVar30._8_4_;
              auVar44._12_4_ = fVar47 + auVar30._12_4_;
              auVar39._0_4_ = auVar39._0_4_ + auVar30._0_4_;
              auVar39._4_4_ = fVar41 + auVar30._4_4_;
              auVar39._8_4_ = fVar33 + auVar30._8_4_;
              auVar39._12_4_ = fVar35 + auVar30._12_4_;
              sVar26 = sVar26 + 1;
              iVar27 = iVar27 + -1;
            } while (iVar27 != 0);
          }
        }
        auVar64 = ZEXT1664(ZEXT816(0) << 0x40);
        aVar10 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                 vinsertps_avx(auVar51,ZEXT416(geomID),0x30);
        uVar18 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                 super_CurveGeometry.super_Geometry.numTimeSteps - 1;
        uVar16 = (ulong)uVar18;
        aVar11 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                 vinsertps_avx(auVar44,ZEXT416((uint)uVar17),0x30);
        aVar12 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                 vinsertps_avx(auVar34,ZEXT416(uVar18),0x30);
        aVar13 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                 vinsertps_avx(auVar39,ZEXT416(uVar18),0x30);
        auVar37._0_4_ = aVar10.x * 0.5 + aVar12.x * 0.5 + aVar11.x * 0.5 + aVar13.x * 0.5;
        auVar37._4_4_ = aVar10.y * 0.5 + aVar12.y * 0.5 + aVar11.y * 0.5 + aVar13.y * 0.5;
        auVar37._8_4_ = aVar10.z * 0.5 + aVar12.z * 0.5 + aVar11.z * 0.5 + aVar13.z * 0.5;
        auVar37._12_4_ =
             aVar10.field_3.w * 0.5 + aVar12.field_3.w * 0.5 +
             aVar11.field_3.w * 0.5 + aVar13.field_3.w * 0.5;
        auVar30 = vminps_avx(local_b8,(undefined1  [16])aVar10);
        auVar49 = ZEXT1664(auVar30);
        auVar30 = vmaxps_avx(local_c8,(undefined1  [16])aVar11);
        auVar52 = ZEXT1664(auVar30);
        auVar30 = vminps_avx(local_118,(undefined1  [16])aVar12);
        auVar63 = ZEXT1664(auVar30);
        auVar30 = vmaxps_avx(local_108,(undefined1  [16])aVar13);
        auVar61 = ZEXT1664(auVar30);
        auVar30 = vminps_avx(local_f8,auVar37);
        auVar59 = ZEXT1664(auVar30);
        auVar30 = vmaxps_avx(local_e8,auVar37);
        auVar57 = ZEXT1664(auVar30);
        auVar30 = vshufpd_avx(local_d8,local_d8,1);
        BVar3 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                super_CurveGeometry.super_Geometry.time_range;
        auVar40._8_4_ = BVar3.lower;
        auVar40._12_4_ = BVar3.upper;
        auVar40._0_4_ = BVar3.lower;
        auVar40._4_4_ = BVar3.upper;
        auVar30 = vcmpps_avx(auVar30,auVar40,1);
        local_1d8 = local_1d8 + 1;
        local_218 = local_218 + uVar16;
        auVar30 = vshufps_avx(ZEXT416((uint)CONCAT71((int7)(local_218 >> 8),uVar23 < uVar16)),
                              auVar30,0x40);
        auVar38 = vpslld_avx(auVar30,0x1f);
        auVar42._8_8_ = local_d8._8_8_;
        auVar42._0_4_ = BVar3.lower;
        auVar42._4_4_ = BVar3.upper;
        auVar29 = vshufps_avx(auVar42,auVar42,100);
        auVar30 = vblendps_avx(local_d8,auVar40,4);
        auVar30 = vblendvps_avx(auVar30,auVar29,auVar38);
        auVar43 = ZEXT1664(auVar30);
        if (uVar23 <= uVar16) {
          uVar23 = uVar16;
        }
        pPVar5 = prims->items;
        pPVar5[local_1c0].lbounds.bounds0.lower.field_0.field_1 = aVar10;
        pPVar5[local_1c0].lbounds.bounds0.upper.field_0.field_1 = aVar11;
        pPVar5[local_1c0].lbounds.bounds1.lower.field_0.field_1 = aVar12;
        pPVar5[local_1c0].lbounds.bounds1.upper.field_0.field_1 = aVar13;
        BVar3 = (BBox1f)vmovlpd_avx(auVar40);
        pPVar5[local_1c0].time_range = BVar3;
        auVar65 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
        local_1c0 = local_1c0 + 1;
      }
LAB_012fde04:
      auVar30 = auVar43._0_16_;
      aVar50 = auVar52._0_16_;
      aVar48 = auVar49._0_16_;
      uVar17 = uVar17 + 1;
    } while (uVar17 < r->_end);
    (__return_storage_ptr__->object_range)._end = local_1d8;
    aVar62 = auVar63._0_16_;
    aVar60 = auVar61._0_16_;
    aVar58 = auVar59._0_16_;
    aVar56 = auVar57._0_16_;
  }
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = aVar48;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = aVar50;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = aVar62;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = aVar60;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = aVar58;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = aVar56;
  __return_storage_ptr__->num_time_segments = local_218;
  __return_storage_ptr__->max_num_time_segments = uVar23;
  (__return_storage_ptr__->max_time_range).lower = (float)(int)auVar30._0_8_;
  (__return_storage_ptr__->max_time_range).upper = (float)(int)((ulong)auVar30._0_8_ >> 0x20);
  (__return_storage_ptr__->time_range).lower = (float)(int)auVar30._8_8_;
  (__return_storage_ptr__->time_range).upper = (float)(int)((ulong)auVar30._8_8_ >> 0x20);
  return __return_storage_ptr__;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims, const BBox1f& t0t1, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfoMB pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbox = linearBounds(j,t0t1);
          const PrimRefMB prim(lbox,this->numTimeSegments(),this->time_range,this->numTimeSegments(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }